

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketOnline.cpp
# Opt level: O2

void __thiscall SocketOnline::send_message(SocketOnline *this,Mat *a)

{
  int u;
  
  u = Mat::toString_pos(a,this->buffer);
  Constant::Util::int_to_header(this->header,u);
  send_message_n(this,this->sock,this->header,4);
  send_message_n(this,this->sock,this->buffer,u);
  return;
}

Assistant:

void SocketOnline::send_message(const Mat &a) {
    int len_buffer;
    len_buffer = a.toString_pos(buffer);
    Constant::Util::int_to_header(header, len_buffer);
    send_message_n(sock, header, HEADER_LEN);
    send_message_n(sock, buffer, len_buffer);
}